

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  MutexLock *this_00;
  AppendFile *this_01;
  string local_50;
  int local_1c;
  string *psStack_18;
  int flushEveryN_local;
  string *basename_local;
  LogFile *this_local;
  
  local_1c = flushEveryN;
  psStack_18 = basename;
  basename_local = &this->basename_;
  noncopyable::noncopyable((noncopyable *)this);
  std::__cxx11::string::string((string *)this,(string *)psStack_18);
  this->flushEveryN_ = local_1c;
  this->count_ = 0;
  this_00 = (MutexLock *)operator_new(0x28);
  MutexLock::MutexLock(this_00);
  std::unique_ptr<MutexLock,std::default_delete<MutexLock>>::
  unique_ptr<std::default_delete<MutexLock>,void>
            ((unique_ptr<MutexLock,std::default_delete<MutexLock>> *)&this->mutex_,this_00);
  std::unique_ptr<AppendFile,std::default_delete<AppendFile>>::
  unique_ptr<std::default_delete<AppendFile>,void>
            ((unique_ptr<AppendFile,std::default_delete<AppendFile>> *)&this->file_);
  std::__cxx11::string::find((char)this,0x2f);
  this_01 = (AppendFile *)operator_new(0x10010);
  std::__cxx11::string::string((string *)&local_50,(string *)psStack_18);
  AppendFile::AppendFile(this_01,&local_50);
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::reset(&this->file_,this_01);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

LogFile::LogFile(const std::string& basename, int flushEveryN)
    : basename_(basename), flushEveryN_(flushEveryN), count_(0), mutex_(new MutexLock) {
    assert(basename_.find('/') >= 0);
    file_.reset(new AppendFile(basename));
}